

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

void kmpp_objs_deinit(void)

{
  KmppObjs *ptr;
  rk_s32 *prVar1;
  bool bVar2;
  KmppObjs *local_28;
  KmppObjDefImpl *impl;
  rk_s32 i;
  KmppObjs *p;
  
  local_28 = objs;
  do {
    LOCK();
    bVar2 = local_28 == objs;
    ptr = objs;
    if (bVar2) {
      objs = (KmppObjs *)0x0;
      ptr = local_28;
    }
    UNLOCK();
    local_28 = ptr;
  } while (!bVar2);
  if ((kmpp_obj_debug & 1) != 0) {
    _mpp_log_l(4,"kmpp_obj","kmpp_objs_deinit objs %p\n",(char *)0x0,ptr);
  }
  if (ptr != (KmppObjs *)0x0) {
    for (impl._4_4_ = 0; impl._4_4_ < ptr->count; impl._4_4_ = impl._4_4_ + 1) {
      prVar1 = &ptr[1].fd + (long)impl._4_4_ * 8;
      if (*(long *)prVar1 != 0) {
        mpp_trie_deinit(*(MppTrie *)prVar1);
        *(long *)prVar1 = 0;
      }
    }
    if (ptr->trie != (MppTrie)0x0) {
      mpp_trie_deinit(ptr->trie);
      ptr->trie = (MppTrie)0x0;
    }
    if (0 < ptr->fd) {
      close(ptr->fd);
      ptr->fd = -1;
    }
    mpp_osal_free("kmpp_objs_deinit",ptr);
  }
  return;
}

Assistant:

__attribute__ ((destructor))
void kmpp_objs_deinit(void)
{
    KmppObjs *p = MPP_FETCH_AND(&objs, NULL);

    obj_dbg_flow("kmpp_objs_deinit objs %p\n", p);

    if (p) {
        rk_s32 i;

        for (i = 0; i < p->count; i++) {
            KmppObjDefImpl *impl = &p->defs[i];

            if (impl->trie) {
                mpp_trie_deinit(impl->trie);
                impl->trie = NULL;
            }
        }

        if (p->trie) {
            mpp_trie_deinit(p->trie);
            p->trie = NULL;
        }

        if (p->fd > 0) {
            close(p->fd);
            p->fd = -1;
        }

        mpp_free(p);
    }
}